

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool startParsing(XML_Parser parser)

{
  XML_Bool XVar1;
  int iVar2;
  __pid_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  char *label;
  ulong uVar6;
  unsigned_long local_38;
  timeval local_30;
  
  if (parser->m_hash_secret_salt == 0) {
    iVar2 = open("/dev/urandom",0);
    if (-1 < iVar2) {
      uVar6 = 0;
      do {
        sVar4 = read(iVar2,(void *)((long)&local_38 + uVar6),8 - uVar6);
        if (0 < sVar4 && 7 < sVar4 + uVar6) {
          close(iVar2);
          label = "/dev/urandom";
          goto LAB_0016355d;
        }
        if (0 < sVar4) {
          uVar6 = sVar4 + uVar6;
        }
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      close(iVar2);
    }
    iVar2 = gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    if (iVar2 != 0) {
      __assert_fail("gettimeofday_res == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                    ,0x3a1,"unsigned long gather_time_entropy(void)");
    }
    _Var3 = getpid();
    label = "fallback(8)";
    local_38 = (_Var3 ^ local_30.tv_usec) * 0x1fffffffffffffff;
LAB_0016355d:
    ENTROPY_DEBUG(label,local_38);
    parser->m_hash_secret_salt = local_38;
  }
  if (parser->m_ns != '\0') {
    XVar1 = setContext(parser,"xml=http://www.w3.org/XML/1998/namespace");
    return XVar1;
  }
  return '\x01';
}

Assistant:

static XML_Bool /* only valid for root parser */
startParsing(XML_Parser parser) {
  /* hash functions must be initialized before setContext() is called */
  if (parser->m_hash_secret_salt == 0)
    parser->m_hash_secret_salt = generate_hash_secret_salt(parser);
  if (parser->m_ns) {
    /* implicit context only set for root parser, since child
       parsers (i.e. external entity parsers) will inherit it
    */
    return setContext(parser, implicitContext);
  }
  return XML_TRUE;
}